

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BranchLayerParams::CopyFrom(BranchLayerParams *this,BranchLayerParams *from)

{
  BranchLayerParams *from_local;
  BranchLayerParams *this_local;
  
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
  }
  return;
}

Assistant:

void BranchLayerParams::CopyFrom(const BranchLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.BranchLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}